

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

FieldType __thiscall
google::protobuf::internal::ExtensionSet::ExtensionType(ExtensionSet *this,int number)

{
  LogMessage *pLVar1;
  LogMessage local_60;
  Voidify local_4d [13];
  LogMessage local_40;
  Voidify local_29;
  Extension *local_28;
  Extension *ext;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  ext._4_4_ = number;
  pEStack_18 = this;
  local_28 = FindOrNull(this,number);
  if (local_28 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0xfb);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [58])
                               "Don\'t lookup extension types if they aren\'t present (1). ");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar1);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_40);
    this_local._7_1_ = '\0';
  }
  else {
    if (((byte)local_28->field_0xa >> 1 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                ((LogMessageDebugFatal *)&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x100);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar1,(char (*) [58])
                                 "Don\'t lookup extension types if they aren\'t present (2). ");
      absl::lts_20250127::log_internal::Voidify::operator&&(local_4d,pLVar1);
      absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                ((LogMessageDebugFatal *)&local_60);
    }
    this_local._7_1_ = local_28->type;
  }
  return this_local._7_1_;
}

Assistant:

FieldType ExtensionSet::ExtensionType(int number) const {
  const Extension* ext = FindOrNull(number);
  if (ext == nullptr) {
    ABSL_DLOG(FATAL)
        << "Don't lookup extension types if they aren't present (1). ";
    return 0;
  }
  if (ext->is_cleared) {
    ABSL_DLOG(FATAL)
        << "Don't lookup extension types if they aren't present (2). ";
  }
  return ext->type;
}